

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.cpp
# Opt level: O3

void __thiscall
cbtConvexInternalShape::getAabbSlow
          (cbtConvexInternalShape *this,cbtTransform *trans,cbtVector3 *minAabb,cbtVector3 *maxAabb)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  float in_XMM0_Da;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  lVar3 = 0;
  do {
    local_68 = 0;
    uStack_60 = 0;
    *(undefined4 *)((long)&local_68 + lVar3 * 4) = 0x3f800000;
    uVar1 = *(undefined8 *)(trans->m_basis).m_el[1].m_floats;
    auVar13._4_4_ = (undefined4)local_68;
    auVar13._0_4_ = (undefined4)local_68;
    auVar13._8_4_ = (undefined4)local_68;
    auVar13._12_4_ = (undefined4)local_68;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(trans->m_basis).m_el[0].m_floats;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(trans->m_basis).m_el[2].m_floats;
    auVar9._0_4_ = local_68._4_4_ * (float)uVar1;
    auVar9._4_4_ = local_68._4_4_ * (float)((ulong)uVar1 >> 0x20);
    auVar9._8_4_ = local_68._4_4_ * 0.0;
    auVar9._12_4_ = local_68._4_4_ * 0.0;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_68._4_4_ * (trans->m_basis).m_el[1].m_floats[2])),
                             auVar13,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar4 = vfmadd231ps_fma(auVar9,auVar13,auVar4);
    auVar5._4_4_ = (undefined4)uStack_60;
    auVar5._0_4_ = (undefined4)uStack_60;
    auVar5._8_4_ = (undefined4)uStack_60;
    auVar5._12_4_ = (undefined4)uStack_60;
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar11);
    auVar4 = vinsertps_avx(auVar4,auVar2,0x28);
    local_50 = auVar4;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_50);
    auVar2 = vmovshdup_avx(auVar4);
    fVar8 = auVar2._0_4_;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[0].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[1].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[2].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar5,ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar4,auVar5,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(ZEXT416((uint)(auVar2._0_4_ + (trans->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar6._0_4_ + (trans->m_origin).m_floats[1])),0x10);
    local_50 = vinsertps_avx(auVar4,ZEXT416((uint)(auVar5._0_4_ + (trans->m_origin).m_floats[2])),
                             0x28);
    maxAabb->m_floats[lVar3] = in_XMM0_Da + *(float *)(local_50 + lVar3 * 4);
    *(undefined4 *)((long)&local_68 + lVar3 * 4) = 0xbf800000;
    uVar1 = *(undefined8 *)(trans->m_basis).m_el[1].m_floats;
    auVar14._4_4_ = (undefined4)local_68;
    auVar14._0_4_ = (undefined4)local_68;
    auVar14._8_4_ = (undefined4)local_68;
    auVar14._12_4_ = (undefined4)local_68;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(trans->m_basis).m_el[0].m_floats;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(trans->m_basis).m_el[2].m_floats;
    auVar10._0_4_ = local_68._4_4_ * (float)uVar1;
    auVar10._4_4_ = local_68._4_4_ * (float)((ulong)uVar1 >> 0x20);
    auVar10._8_4_ = local_68._4_4_ * 0.0;
    auVar10._12_4_ = local_68._4_4_ * 0.0;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_68._4_4_ * (trans->m_basis).m_el[1].m_floats[2])),
                             auVar14,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar4 = vfmadd231ps_fma(auVar10,auVar14,auVar6);
    auVar7._4_4_ = (undefined4)uStack_60;
    auVar7._0_4_ = (undefined4)uStack_60;
    auVar7._8_4_ = (undefined4)uStack_60;
    auVar7._12_4_ = (undefined4)uStack_60;
    auVar2 = vfmadd231ss_fma(auVar2,auVar7,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vfmadd231ps_fma(auVar4,auVar7,auVar12);
    auVar4 = vinsertps_avx(auVar4,auVar2,0x28);
    local_40 = auVar4;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_40);
    auVar2 = vmovshdup_avx(auVar4);
    fVar8 = auVar2._0_4_;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[0].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[1].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (trans->m_basis).m_el[2].m_floats[1])),auVar4,
                             ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar7,ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar7,ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar4,auVar7,ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]));
    auVar4 = vinsertps_avx(ZEXT416((uint)(auVar2._0_4_ + (trans->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar6._0_4_ + (trans->m_origin).m_floats[1])),0x10);
    local_50 = vinsertps_avx(auVar4,ZEXT416((uint)(auVar5._0_4_ + (trans->m_origin).m_floats[2])),
                             0x28);
    minAabb->m_floats[lVar3] = *(float *)(local_50 + lVar3 * 4) - in_XMM0_Da;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void cbtConvexInternalShape::getAabbSlow(const cbtTransform& trans, cbtVector3& minAabb, cbtVector3& maxAabb) const
{
#ifndef __SPU__
	//use localGetSupportingVertexWithoutMargin?
	cbtScalar margin = getMargin();
	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);

		cbtVector3 sv = localGetSupportingVertex(vec * trans.getBasis());

		cbtVector3 tmp = trans(sv);
		maxAabb[i] = tmp[i] + margin;
		vec[i] = cbtScalar(-1.);
		tmp = trans(localGetSupportingVertex(vec * trans.getBasis()));
		minAabb[i] = tmp[i] - margin;
	}
#endif
}